

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O0

void __thiscall Fl_File_Chooser::update_favorites(Fl_File_Chooser *this)

{
  char *src;
  Fl_Menu_Item *this_00;
  char *home;
  char menuname [2048];
  char pathname [2048];
  int i;
  Fl_File_Chooser *this_local;
  
  Fl_Menu_::clear(&this->favoritesButton->super_Fl_Menu_);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,"bla");
  Fl_Menu_::clear(&this->favoritesButton->super_Fl_Menu_);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,add_favorites_label,0x80061,
                (Fl_Callback *)0x0,(void *)0x0,0);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,manage_favorites_label,0x8006d,
                (Fl_Callback *)0x0,(void *)0x0,0x80);
  Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,filesystems_label,0x80066,(Fl_Callback *)0x0,
                (void *)0x0,0);
  src = get_homedir();
  if (src != (char *)0x0) {
    quote_pathname((char *)&home,src,0x800);
    Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,(char *)&home,0x80068,(Fl_Callback *)0x0,
                  (void *)0x0,0);
  }
  pathname[0x7fc] = '\0';
  pathname[0x7fd] = '\0';
  pathname[0x7fe] = '\0';
  pathname[0x7ff] = '\0';
  for (; (int)pathname._2044_4_ < 100; pathname._2044_4_ = pathname._2044_4_ + 1) {
    sprintf((char *)&home,"favorite%02d",(ulong)(uint)pathname._2044_4_);
    Fl_Preferences::get(prefs_,(char *)&home,menuname + 0x7f8,"",0x800);
    if (menuname[0x7f8] == '\0') break;
    quote_pathname((char *)&home,menuname + 0x7f8,0x800);
    if ((int)pathname._2044_4_ < 10) {
      Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,(char *)&home,pathname._2044_4_ + 0x80030
                    ,(Fl_Callback *)0x0,(void *)0x0,0);
    }
    else {
      Fl_Menu_::add(&this->favoritesButton->super_Fl_Menu_,(char *)&home);
    }
  }
  if (pathname._2044_4_ == 100) {
    this_00 = Fl_Menu_::menu(&this->favoritesButton->super_Fl_Menu_);
    Fl_Menu_Item::deactivate(this_00);
  }
  return;
}

Assistant:

void
Fl_File_Chooser::update_favorites()
{
  int		i;			// Looping var
  char		pathname[FL_PATH_MAX],		// Pathname
		menuname[2048];		// Menu name
  const char	*home;			// Home directory


  favoritesButton->clear();
  favoritesButton->add("bla");
  favoritesButton->clear();
  favoritesButton->add(add_favorites_label, FL_ALT + 'a', 0);
  favoritesButton->add(manage_favorites_label, FL_ALT + 'm', 0, 0, FL_MENU_DIVIDER);
  favoritesButton->add(filesystems_label, FL_ALT + 'f', 0);

  if ((home = get_homedir()) != NULL) {
    quote_pathname(menuname, home, sizeof(menuname));
    favoritesButton->add(menuname, FL_ALT + 'h', 0);
  }

  for (i = 0; i < 100; i ++) {
    sprintf(menuname, "favorite%02d", i);
    prefs_->get(menuname, pathname, "", sizeof(pathname));
    if (!pathname[0]) break;

    quote_pathname(menuname, pathname, sizeof(menuname));

    if (i < 10) favoritesButton->add(menuname, FL_ALT + '0' + i, 0);
    else favoritesButton->add(menuname);
  }

  if (i == 100) ((Fl_Menu_Item *)favoritesButton->menu())[0].deactivate();
}